

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.h
# Opt level: O2

void __thiscall
rapidjson::
GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::RemoveDotSegments(GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                    *this)

{
  Ch *pCVar1;
  SizeType SVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  size_t __n;
  ulong uVar8;
  
  SVar2 = GetPathStringLength(this);
  uVar8 = (ulong)SVar2;
  uVar4 = 0;
  uVar5 = 0;
  do {
    pCVar1 = this->path_;
    if (uVar8 < uVar4 || uVar8 - uVar4 == 0) {
      pCVar1[uVar5] = '\0';
      return;
    }
    lVar7 = -uVar4;
    for (sVar3 = 0;
        (__n = uVar8 - uVar4, -lVar7 != uVar8 && (__n = sVar3, (pCVar1 + uVar4)[sVar3] != '/'));
        sVar3 = sVar3 + 1) {
      lVar7 = lVar7 + -1;
    }
    if (__n == 1) {
      uVar6 = uVar5;
      if (pCVar1[uVar4] != '.') goto LAB_0011b6f5;
    }
    else if (((__n == 2) && (pCVar1[uVar4] == '.')) && (pCVar1[uVar4 + 1] == '.')) {
      if (uVar5 == 0) {
LAB_0011b730:
        uVar6 = 0;
      }
      else {
        if (pCVar1[uVar5 - 1] != '/') {
          __assert_fail("newpos == 0 || path_[newpos - 1] == \'/\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/uri.h"
                        ,0x1ac,
                        "void rapidjson::GenericUri<rapidjson::GenericValue<rapidjson::UTF8<>>>::RemoveDotSegments() [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                       );
        }
        uVar6 = 1;
        if (uVar5 != 1) {
          do {
            if (uVar5 == 1) goto LAB_0011b730;
            uVar6 = uVar5 - 1;
            lVar7 = uVar5 - 2;
            uVar5 = uVar6;
          } while (pCVar1[lVar7] != '/');
        }
      }
    }
    else {
LAB_0011b6f5:
      if (uVar4 < uVar5) {
        __assert_fail("newpos <= pathpos",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/uri.h"
                      ,0x1bd,
                      "void rapidjson::GenericUri<rapidjson::GenericValue<rapidjson::UTF8<>>>::RemoveDotSegments() [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                     );
      }
      memmove(pCVar1 + uVar5,pCVar1 + uVar4,__n);
      uVar6 = uVar5 + __n;
      if ((ulong)-lVar7 < uVar8) {
        this->path_[uVar6] = '/';
        uVar6 = uVar6 + 1;
      }
    }
    uVar4 = uVar4 + __n + 1;
    uVar5 = uVar6;
  } while( true );
}

Assistant:

void RemoveDotSegments() {
        std::size_t pathlen = GetPathStringLength();
        std::size_t pathpos = 0;  // Position in path_
        std::size_t newpos = 0;   // Position in new path_

        // Loop through each segment in original path_
        while (pathpos < pathlen) {
            // Get next segment, bounded by '/' or end
            size_t slashpos = 0;
            while ((pathpos + slashpos) < pathlen) {
                if (path_[pathpos + slashpos] == '/') break;
                slashpos++;
            }
            // Check for .. and . segments
            if (slashpos == 2 && path_[pathpos] == '.' && path_[pathpos + 1] == '.') {
                // Backup a .. segment in the new path_
                // We expect to find a previously added slash at the end or nothing
                RAPIDJSON_ASSERT(newpos == 0 || path_[newpos - 1] == '/');
                size_t lastslashpos = newpos;
                // Make sure we don't go beyond the start segment
                if (lastslashpos > 1) {
                    // Find the next to last slash and back up to it
                    lastslashpos--;
                    while (lastslashpos > 0) {
                        if (path_[lastslashpos - 1] == '/') break;
                        lastslashpos--;
                    }
                    // Set the new path_ position
                    newpos = lastslashpos;
                }
            } else if (slashpos == 1 && path_[pathpos] == '.') {
                // Discard . segment, leaves new path_ unchanged
            } else {
                // Move any other kind of segment to the new path_
                RAPIDJSON_ASSERT(newpos <= pathpos);
                std::memmove(&path_[newpos], &path_[pathpos], slashpos * sizeof(Ch));
                newpos += slashpos;
                // Add slash if not at end
                if ((pathpos + slashpos) < pathlen) {
                    path_[newpos] = '/';
                    newpos++;
                }
            }
            // Move to next segment
            pathpos += slashpos + 1;
        }
        path_[newpos] = '\0';
    }